

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::Internal_DecrementCurrentPosition(ON_BinaryArchive *this,ON__UINT64 delta)

{
  ulong uVar1;
  ON__UINT64 new_pos;
  
  uVar1 = this->m_current_positionX;
  if (uVar1 < delta) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2d0,"","Attempt to set current position before start of archive.");
  }
  else {
    this->m_current_positionX = uVar1 - delta;
  }
  return delta <= uVar1;
}

Assistant:

bool ON_BinaryArchive::Internal_DecrementCurrentPosition(
  ON__UINT64 delta
)
{
  if (m_current_positionX >= delta)
  {
    const ON__UINT64 new_pos = m_current_positionX - delta;
    m_current_positionX = new_pos;
    return true;
  }

  ON_ERROR("Attempt to set current position before start of archive.");

  return false;
}